

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool anon_unknown.dwarf_20a43d::IsLoadAliasedWithStore
               (VmInstruction *loadInst,VmInstruction *storeInst)

{
  VmValue *pVVar1;
  VmValue *pVVar2;
  TypeBase *pTVar3;
  bool bVar4;
  VmValue **ppVVar5;
  VmValue *pVVar6;
  VmValue *pVVar7;
  
  ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&loadInst->arguments,0);
  pVVar1 = *ppVVar5;
  ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&loadInst->arguments,1);
  pVVar6 = *ppVVar5;
  if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
    pVVar6 = (VmValue *)0x0;
  }
  ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&storeInst->arguments,0);
  pVVar2 = *ppVVar5;
  ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&storeInst->arguments,1);
  pVVar7 = *ppVVar5;
  if ((pVVar7 == (VmValue *)0x0) || (pVVar7->typeID != 1)) {
    pVVar7 = (VmValue *)0x0;
  }
  switch(loadInst->cmd) {
  case VM_INST_LOAD_BYTE:
    if (storeInst->cmd != VM_INST_STORE_BYTE) break;
    goto LAB_00258ca2;
  case VM_INST_LOAD_SHORT:
    if (storeInst->cmd == VM_INST_STORE_SHORT) goto LAB_00258ca2;
    break;
  case VM_INST_LOAD_INT:
    if (storeInst->cmd == VM_INST_STORE_INT) goto LAB_00258ca2;
    break;
  case VM_INST_LOAD_FLOAT:
    if (storeInst->cmd == VM_INST_STORE_FLOAT) goto LAB_00258ca2;
    break;
  case VM_INST_LOAD_DOUBLE:
    if (storeInst->cmd == VM_INST_STORE_DOUBLE) goto LAB_00258ca2;
    break;
  case VM_INST_LOAD_LONG:
    if (storeInst->cmd == VM_INST_STORE_LONG) goto LAB_00258ca2;
  }
  bVar4 = IsBuiltInStructLoadStore(loadInst);
  if ((bVar4) && (bVar4 = IsBuiltInStructLoadStore(storeInst), bVar4)) {
LAB_00258ca2:
    pTVar3 = (pVVar1->type).structType;
    if (((pTVar3 == (TypeBase *)0x0) || (pTVar3 != (pVVar2->type).structType)) ||
       (*(int *)&pVVar6[1]._vptr_VmValue == *(int *)&pVVar7[1]._vptr_VmValue)) {
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  else {
    bVar4 = true;
    if (loadInst->cmd != VM_INST_LOAD_STRUCT) {
      bVar4 = storeInst->cmd == VM_INST_STORE_STRUCT;
    }
  }
  return bVar4;
}

Assistant:

bool IsLoadAliasedWithStore(VmInstruction *loadInst, VmInstruction *storeInst)
	{
		VmValue *loadAddress = loadInst->arguments[0];
		VmConstant *loadOffset = getType<VmConstant>(loadInst->arguments[1]);

		VmValue *storeAddress = storeInst->arguments[0];
		VmConstant *storeOffset = getType<VmConstant>(storeInst->arguments[1]);

		if(loadInst->cmd == VM_INST_LOAD_BYTE && storeInst->cmd == VM_INST_STORE_BYTE)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_SHORT && storeInst->cmd == VM_INST_STORE_SHORT)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_INT && storeInst->cmd == VM_INST_STORE_INT)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_LONG && storeInst->cmd == VM_INST_STORE_LONG)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_FLOAT && storeInst->cmd == VM_INST_STORE_FLOAT)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(loadInst->cmd == VM_INST_LOAD_DOUBLE && storeInst->cmd == VM_INST_STORE_DOUBLE)
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		if(IsBuiltInStructLoadStore(loadInst) && IsBuiltInStructLoadStore(storeInst))
		{
			if(loadAddress->type.structType && loadAddress->type.structType == storeAddress->type.structType)
			{
				if(loadOffset->iValue != storeOffset->iValue)
					return false;
			}

			return true;
		}

		// Small store can overwrite struct memory
		if(loadInst->cmd == VM_INST_LOAD_STRUCT)
			return true;

		// Struct store can overwrite other types
		if(storeInst->cmd == VM_INST_STORE_STRUCT)
			return true;

		return false;
	}